

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O1

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::trivialHeuristic(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *lp)

{
  long lVar1;
  undefined8 *puVar2;
  uint *puVar3;
  Tolerances *pTVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  Item *pIVar6;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar7;
  pointer pnVar8;
  Real RVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  int iVar21;
  cpp_dec_float<100U,_int,_void> *pcVar22;
  cpp_dec_float<100U,_int,_void> *pcVar23;
  byte bVar24;
  cpp_dec_float<100U,_int,_void> *pcVar25;
  uint uVar26;
  long lVar27;
  fpclass_type fVar28;
  long lVar29;
  long in_FS_OFFSET;
  type t;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  downLocks;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  upLocks;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  locksol;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_5;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  uppersol;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  lowersol;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  zerosol;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lockObj;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  upperObj;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lowerObj;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  zeroObj;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_4;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  int32_t local_a90;
  int local_a8c;
  cpp_dec_float<100U,_int,_void> local_a88;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_a30;
  cpp_dec_float<100U,_int,_void> local_a28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_9d8;
  long local_9d0;
  uint local_9c8 [2];
  uint auStack_9c0 [2];
  uint local_9b8 [2];
  uint auStack_9b0 [2];
  uint auStack_9a8 [2];
  uint uStack_9a0;
  uint local_99c;
  uint uStack_998;
  uint auStack_994 [5];
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_980;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_968;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_950;
  undefined8 local_938;
  undefined8 uStack_930;
  long local_920;
  cpp_dec_float<100U,_int,_void> local_918;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_8c8;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_8b0;
  cpp_dec_float<100U,_int,_void> local_898;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_840;
  undefined4 local_828;
  uint uStack_824;
  undefined4 uStack_820;
  uint uStack_81c;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_818;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_800;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_7e8;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_7d0;
  cpp_dec_float<100U,_int,_void> local_7b8;
  cpp_dec_float<100U,_int,_void> local_768;
  cpp_dec_float<100U,_int,_void> local_718;
  cpp_dec_float<100U,_int,_void> local_6c8;
  cpp_dec_float<100U,_int,_void> local_678;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_628;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5d8;
  cpp_dec_float<100U,_int,_void> local_588;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_538;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4e8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_498;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_448;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3f8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3a8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_358;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_308;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_268;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_218;
  cpp_dec_float<100U,_int,_void> local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_178;
  cpp_dec_float<100U,_int,_void> local_128;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_80;
  
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)&local_840,
               (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)&local_8b0,
               (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)&local_8c8,
               (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)&local_950,
               (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase(&local_968,
               (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase(&local_980,
               (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  local_6c8.data._M_elems._0_8_ =
       *(undefined8 *)
        (this->
        super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).m_objoffset.m_backend.data._M_elems;
  local_6c8.data._M_elems._8_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 2);
  local_6c8.data._M_elems._16_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 4);
  local_6c8.data._M_elems._24_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 6);
  local_6c8.data._M_elems._32_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 8);
  local_6c8.data._M_elems._40_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 10);
  local_6c8.data._M_elems._48_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 0xc);
  local_6c8.data._M_elems._56_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 0xe);
  local_7b8.exp =
       (this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).m_objoffset.m_backend.exp;
  local_7b8.neg =
       (this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).m_objoffset.m_backend.neg;
  local_7b8.fpclass =
       (this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).m_objoffset.m_backend.fpclass;
  local_7b8.prec_elem =
       (this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).m_objoffset.m_backend.prec_elem;
  local_718.data._M_elems._0_8_ =
       *(undefined8 *)
        (this->
        super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).m_objoffset.m_backend.data._M_elems;
  local_718.data._M_elems._8_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 2);
  local_718.data._M_elems._16_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 4);
  local_718.data._M_elems._24_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 6);
  local_718.data._M_elems._32_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 8);
  local_718.data._M_elems._40_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 10);
  local_718.data._M_elems._48_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 0xc);
  local_718.data._M_elems._56_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 0xe);
  local_768.data._M_elems._0_8_ =
       *(undefined8 *)
        (this->
        super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).m_objoffset.m_backend.data._M_elems;
  local_768.data._M_elems._8_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 2);
  local_768.data._M_elems._16_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 4);
  local_768.data._M_elems._24_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 6);
  local_768.data._M_elems._32_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 8);
  local_768.data._M_elems._40_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 10);
  local_768.data._M_elems._48_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 0xc);
  local_768.data._M_elems._56_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 0xe);
  local_7b8.data._M_elems._0_8_ =
       *(undefined8 *)
        (this->
        super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).m_objoffset.m_backend.data._M_elems;
  local_7b8.data._M_elems._8_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 2);
  local_7b8.data._M_elems._16_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 4);
  local_7b8.data._M_elems._24_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 6);
  local_7b8.data._M_elems._32_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 8);
  local_7b8.data._M_elems._40_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 10);
  local_7b8.data._M_elems._48_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 0xc);
  local_7b8.data._M_elems._56_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 0xe);
  local_768.exp = local_7b8.exp;
  local_768.neg = local_7b8.neg;
  local_768.fpclass = local_7b8.fpclass;
  local_768.prec_elem = local_7b8.prec_elem;
  local_718.exp = local_7b8.exp;
  local_718.neg = local_7b8.neg;
  local_718.fpclass = local_7b8.fpclass;
  local_718.prec_elem = local_7b8.prec_elem;
  local_6c8.exp = local_7b8.exp;
  local_6c8.neg = local_7b8.neg;
  local_6c8.fpclass = local_7b8.fpclass;
  local_6c8.prec_elem = local_7b8.prec_elem;
  ::soplex::infinity::__tls_init();
  local_938 = *(double *)(in_FS_OFFSET + -8);
  local_898.fpclass = cpp_dec_float_finite;
  local_898.prec_elem = 0x10;
  local_898.data._M_elems[0] = 0;
  local_898.data._M_elems[1] = 0;
  local_898.data._M_elems[2] = 0;
  local_898.data._M_elems[3] = 0;
  local_898.data._M_elems[4] = 0;
  local_898.data._M_elems[5] = 0;
  local_898.data._M_elems[6] = 0;
  local_898.data._M_elems[7] = 0;
  local_898.data._M_elems[8] = 0;
  local_898.data._M_elems[9] = 0;
  local_898.data._M_elems[10] = 0;
  local_898.data._M_elems[0xb] = 0;
  local_898.data._M_elems[0xc] = 0;
  local_898.data._M_elems[0xd] = 0;
  local_898.data._M_elems._56_5_ = 0;
  local_898.data._M_elems[0xf]._1_3_ = 0;
  local_898.exp = 0;
  local_898.neg = false;
  uStack_930 = 0;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&local_898,local_938);
  feastol((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_a28,this);
  local_1c8.fpclass = cpp_dec_float_finite;
  local_1c8.prec_elem = 0x10;
  local_1c8.data._M_elems[0] = 0;
  local_1c8.data._M_elems[1] = 0;
  local_1c8.data._M_elems[2] = 0;
  local_1c8.data._M_elems[3] = 0;
  local_1c8.data._M_elems[4] = 0;
  local_1c8.data._M_elems[5] = 0;
  local_1c8.data._M_elems[6] = 0;
  local_1c8.data._M_elems[7] = 0;
  local_1c8.data._M_elems[8] = 0;
  local_1c8.data._M_elems[9] = 0;
  local_1c8.data._M_elems[10] = 0;
  local_1c8.data._M_elems[0xb] = 0;
  local_1c8.data._M_elems[0xc] = 0;
  local_1c8.data._M_elems[0xd] = 0;
  local_1c8.data._M_elems._56_5_ = 0;
  local_1c8.data._M_elems[0xf]._1_3_ = 0;
  local_1c8.exp = 0;
  local_1c8.neg = false;
  local_a88.fpclass = cpp_dec_float_finite;
  local_a88.prec_elem = 0x10;
  local_a88.data._M_elems[0] = 0;
  local_a88.data._M_elems[1] = 0;
  local_a88.data._M_elems[2] = 0;
  local_a88.data._M_elems[3] = 0;
  local_a88.data._M_elems[4] = 0;
  local_a88.data._M_elems[5] = 0;
  local_a88.data._M_elems[6] = 0;
  local_a88.data._M_elems[7] = 0;
  local_a88.data._M_elems[8] = 0;
  local_a88.data._M_elems[9] = 0;
  local_a88.data._M_elems[10] = 0;
  local_a88.data._M_elems[0xb] = 0;
  local_a88.data._M_elems[0xc] = 0;
  local_a88.data._M_elems[0xd] = 0;
  local_a88.data._M_elems._56_5_ = 0;
  local_a88.data._M_elems[0xf]._1_3_ = 0;
  local_a88.exp = 0;
  local_a88.neg = false;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&local_a88,1.0);
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
            (&local_1c8,&local_a88,&local_a28);
  ::soplex::infinity::__tls_init();
  local_d8.m_backend.fpclass = cpp_dec_float_finite;
  local_d8.m_backend.prec_elem = 0x10;
  local_d8.m_backend.data._M_elems[0] = 0;
  local_d8.m_backend.data._M_elems[1] = 0;
  local_d8.m_backend.data._M_elems[2] = 0;
  local_d8.m_backend.data._M_elems[3] = 0;
  local_d8.m_backend.data._M_elems[4] = 0;
  local_d8.m_backend.data._M_elems[5] = 0;
  local_d8.m_backend.data._M_elems[6] = 0;
  local_d8.m_backend.data._M_elems[7] = 0;
  local_d8.m_backend.data._M_elems[8] = 0;
  local_d8.m_backend.data._M_elems[9] = 0;
  local_d8.m_backend.data._M_elems[10] = 0;
  local_d8.m_backend.data._M_elems[0xb] = 0;
  local_d8.m_backend.data._M_elems[0xc] = 0;
  local_d8.m_backend.data._M_elems[0xd] = 0;
  local_d8.m_backend.data._M_elems._56_5_ = 0;
  local_d8.m_backend.data._M_elems[0xf]._1_3_ = 0;
  local_d8.m_backend.exp = 0;
  local_d8.m_backend.neg = false;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&local_d8,local_938);
  pTVar4 = (this->
           super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var5 = (this->
           super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
    }
  }
  RVar9 = Tolerances::epsilon(pTVar4);
  bVar18 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                     ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)&local_1c8,&local_d8,RVar9);
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
  }
  if (bVar18) {
    feastol((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *)&local_918,this);
    local_a28.fpclass = cpp_dec_float_finite;
    local_a28.prec_elem = 0x10;
    local_a28.data._M_elems[0] = 0;
    local_a28.data._M_elems[1] = 0;
    local_a28.data._M_elems[2] = 0;
    local_a28.data._M_elems[3] = 0;
    local_a28.data._M_elems[4] = 0;
    local_a28.data._M_elems[5] = 0;
    local_a28.data._M_elems[6] = 0;
    local_a28.data._M_elems[7] = 0;
    local_a28.data._M_elems[8] = 0;
    local_a28.data._M_elems[9] = 0;
    local_a28.data._M_elems[10] = 0;
    local_a28.data._M_elems[0xb] = 0;
    local_a28.data._M_elems[0xc] = 0;
    local_a28.data._M_elems[0xd] = 0;
    local_a28.data._M_elems._56_5_ = 0;
    local_a28.data._M_elems[0xf]._1_3_ = 0;
    local_a28.exp = 0;
    local_a28.neg = false;
    local_a88.fpclass = cpp_dec_float_finite;
    local_a88.prec_elem = 0x10;
    local_a88.data._M_elems[0] = 0;
    local_a88.data._M_elems[1] = 0;
    local_a88.data._M_elems[2] = 0;
    local_a88.data._M_elems[3] = 0;
    local_a88.data._M_elems[4] = 0;
    local_a88.data._M_elems[5] = 0;
    local_a88.data._M_elems[6] = 0;
    local_a88.data._M_elems[7] = 0;
    local_a88.data._M_elems[8] = 0;
    local_a88.data._M_elems[9] = 0;
    local_a88.data._M_elems[10] = 0;
    local_a88.data._M_elems[0xb] = 0;
    local_a88.data._M_elems[0xc] = 0;
    local_a88.data._M_elems[0xd] = 0;
    local_a88.data._M_elems._56_5_ = 0;
    local_a88.data._M_elems[0xf]._1_3_ = 0;
    local_a88.exp = 0;
    local_a88.neg = false;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_a88,1.0);
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              (&local_a28,&local_a88,&local_918);
    local_898.data._M_elems[0] = local_a28.data._M_elems[0];
    local_898.data._M_elems[1] = local_a28.data._M_elems[1];
    local_898.data._M_elems[2] = local_a28.data._M_elems[2];
    local_898.data._M_elems[3] = local_a28.data._M_elems[3];
    local_898.data._M_elems[4] = local_a28.data._M_elems[4];
    local_898.data._M_elems[5] = local_a28.data._M_elems[5];
    local_898.data._M_elems[6] = local_a28.data._M_elems[6];
    local_898.data._M_elems[7] = local_a28.data._M_elems[7];
    local_898.data._M_elems[8] = local_a28.data._M_elems[8];
    local_898.data._M_elems[9] = local_a28.data._M_elems[9];
    local_898.data._M_elems[10] = local_a28.data._M_elems[10];
    local_898.data._M_elems[0xb] = local_a28.data._M_elems[0xb];
    local_898.data._M_elems[0xc] = local_a28.data._M_elems[0xc];
    local_898.data._M_elems[0xd] = local_a28.data._M_elems[0xd];
    local_898.data._M_elems._56_5_ = local_a28.data._M_elems._56_5_;
    local_898.data._M_elems[0xf]._1_3_ = local_a28.data._M_elems[0xf]._1_3_;
    local_898.exp = local_a28.exp;
    local_898.neg = local_a28.neg;
    local_898.fpclass = local_a28.fpclass;
    local_898.prec_elem = local_a28.prec_elem;
  }
  lVar27 = (long)(lp->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum;
  if (lVar27 < 1) {
    bVar18 = true;
  }
  else {
    uStack_824 = local_938._4_4_ ^ 0x80000000;
    uStack_81c = uStack_930._4_4_ ^ 0x80000000;
    local_828 = (undefined4)local_938;
    uStack_820 = (undefined4)uStack_930;
    bVar18 = true;
    local_a30 = lp;
    do {
      lVar1 = lVar27 + -1;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                (&local_968.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend,0);
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                (&local_980.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend,0);
      pIVar6 = (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.theitem;
      iVar21 = (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thekey[lVar1].idx;
      local_9d0 = lVar27;
      local_920 = lVar1;
      if (0 < pIVar6[iVar21].data.
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .memused) {
        pIVar6 = pIVar6 + iVar21;
        lVar29 = 0;
        lVar27 = 0;
        do {
          pNVar7 = (pIVar6->data).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .m_elem;
          puVar2 = (undefined8 *)((long)&(pNVar7->val).m_backend.data + lVar29);
          uVar10 = *puVar2;
          uVar11 = puVar2[1];
          puVar2 = (undefined8 *)((long)&(pNVar7->val).m_backend.data + lVar29 + 0x10);
          uVar12 = *puVar2;
          uVar13 = puVar2[1];
          puVar2 = (undefined8 *)((long)&(pNVar7->val).m_backend.data + lVar29 + 0x20);
          uVar14 = *puVar2;
          uVar15 = puVar2[1];
          puVar2 = (undefined8 *)((long)&(pNVar7->val).m_backend.data + lVar29 + 0x30);
          uVar16 = *puVar2;
          uVar17 = puVar2[1];
          local_a28.data._M_elems[0xc] = (uint)uVar16;
          local_a28.data._M_elems[0xd] = (uint)((ulong)uVar16 >> 0x20);
          local_a28.data._M_elems._56_5_ = SUB85(uVar17,0);
          local_a28.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar17 >> 0x28);
          local_a28.data._M_elems[8] = (uint)uVar14;
          local_a28.data._M_elems[9] = (uint)((ulong)uVar14 >> 0x20);
          local_a28.data._M_elems[10] = (uint)uVar15;
          local_a28.data._M_elems[0xb] = (uint)((ulong)uVar15 >> 0x20);
          local_a28.data._M_elems[4] = (uint)uVar12;
          local_a28.data._M_elems[5] = (uint)((ulong)uVar12 >> 0x20);
          local_a28.data._M_elems[6] = (uint)uVar13;
          local_a28.data._M_elems[7] = (uint)((ulong)uVar13 >> 0x20);
          local_a28.data._M_elems[0] = (uint)uVar10;
          local_a28.data._M_elems[1] = (uint)((ulong)uVar10 >> 0x20);
          local_a28.data._M_elems[2] = (uint)uVar11;
          local_a28.data._M_elems[3] = (uint)((ulong)uVar11 >> 0x20);
          local_a28.exp = *(int *)((long)&(pNVar7->val).m_backend.data + lVar29 + 0x40);
          local_a28.neg = *(bool *)((long)&(pNVar7->val).m_backend.data + lVar29 + 0x44);
          local_a28._72_8_ = *(undefined8 *)((long)&(pNVar7->val).m_backend.data + lVar29 + 0x48);
          iVar21 = *(int *)((long)(&((pIVar6->data).
                                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    .m_elem)->val + 1) + lVar29);
          pnVar8 = (local_a30->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).left.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_218.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar8[iVar21].m_backend.data;
          local_218.m_backend.data._M_elems._8_8_ =
               *(undefined8 *)((long)&pnVar8[iVar21].m_backend.data + 8);
          puVar3 = (uint *)((long)&pnVar8[iVar21].m_backend.data + 0x10);
          local_218.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar3;
          local_218.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar3 + 2);
          puVar3 = (uint *)((long)&pnVar8[iVar21].m_backend.data + 0x20);
          local_218.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar3;
          local_218.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar3 + 2);
          puVar3 = (uint *)((long)&pnVar8[iVar21].m_backend.data + 0x30);
          local_218.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar3;
          local_218.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar3 + 2);
          local_218.m_backend.exp = pnVar8[iVar21].m_backend.exp;
          local_218.m_backend.neg = pnVar8[iVar21].m_backend.neg;
          local_218.m_backend.fpclass = pnVar8[iVar21].m_backend.fpclass;
          local_218.m_backend.prec_elem = pnVar8[iVar21].m_backend.prec_elem;
          ::soplex::infinity::__tls_init();
          local_268.m_backend.fpclass = cpp_dec_float_finite;
          local_268.m_backend.prec_elem = 0x10;
          local_268.m_backend.data._M_elems[0] = 0;
          local_268.m_backend.data._M_elems[1] = 0;
          local_268.m_backend.data._M_elems[2] = 0;
          local_268.m_backend.data._M_elems[3] = 0;
          local_268.m_backend.data._M_elems[4] = 0;
          local_268.m_backend.data._M_elems[5] = 0;
          local_268.m_backend.data._M_elems[6] = 0;
          local_268.m_backend.data._M_elems[7] = 0;
          local_268.m_backend.data._M_elems[8] = 0;
          local_268.m_backend.data._M_elems[9] = 0;
          local_268.m_backend.data._M_elems[10] = 0;
          local_268.m_backend.data._M_elems[0xb] = 0;
          local_268.m_backend.data._M_elems[0xc] = 0;
          local_268.m_backend.data._M_elems[0xd] = 0;
          local_268.m_backend.data._M_elems._56_5_ = 0;
          local_268.m_backend.data._M_elems[0xf]._1_3_ = 0;
          local_268.m_backend.exp = 0;
          local_268.m_backend.neg = false;
          boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                    ((cpp_dec_float<100u,int,void> *)&local_268,
                     (double)CONCAT44(uStack_824,local_828));
          pTVar4 = (this->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          p_Var5 = (this->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
            }
          }
          RVar9 = Tolerances::epsilon(pTVar4);
          bVar19 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                             (&local_218,&local_268,RVar9);
          if (bVar19) {
            iVar21 = *(int *)((long)(&((pIVar6->data).
                                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      .m_elem)->val + 1) + lVar29);
            pnVar8 = (local_a30->
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).right.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_2b8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar8[iVar21].m_backend.data;
            local_2b8.m_backend.data._M_elems._8_8_ =
                 *(undefined8 *)((long)&pnVar8[iVar21].m_backend.data + 8);
            puVar3 = (uint *)((long)&pnVar8[iVar21].m_backend.data + 0x10);
            local_2b8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar3;
            local_2b8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar3 + 2);
            puVar3 = (uint *)((long)&pnVar8[iVar21].m_backend.data + 0x20);
            local_2b8.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar3;
            local_2b8.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar3 + 2);
            puVar3 = (uint *)((long)&pnVar8[iVar21].m_backend.data + 0x30);
            local_2b8.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar3;
            local_2b8.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar3 + 2);
            local_2b8.m_backend.exp = pnVar8[iVar21].m_backend.exp;
            local_2b8.m_backend.neg = pnVar8[iVar21].m_backend.neg;
            local_2b8.m_backend.fpclass = pnVar8[iVar21].m_backend.fpclass;
            local_2b8.m_backend.prec_elem = pnVar8[iVar21].m_backend.prec_elem;
            ::soplex::infinity::__tls_init();
            local_308.m_backend.fpclass = cpp_dec_float_finite;
            local_308.m_backend.prec_elem = 0x10;
            local_308.m_backend.data._M_elems[0] = 0;
            local_308.m_backend.data._M_elems[1] = 0;
            local_308.m_backend.data._M_elems[2] = 0;
            local_308.m_backend.data._M_elems[3] = 0;
            local_308.m_backend.data._M_elems[4] = 0;
            local_308.m_backend.data._M_elems[5] = 0;
            local_308.m_backend.data._M_elems[6] = 0;
            local_308.m_backend.data._M_elems[7] = 0;
            local_308.m_backend.data._M_elems[8] = 0;
            local_308.m_backend.data._M_elems[9] = 0;
            local_308.m_backend.data._M_elems[10] = 0;
            local_308.m_backend.data._M_elems[0xb] = 0;
            local_308.m_backend.data._M_elems[0xc] = 0;
            local_308.m_backend.data._M_elems[0xd] = 0;
            local_308.m_backend.data._M_elems._56_5_ = 0;
            local_308.m_backend.data._M_elems[0xf]._1_3_ = 0;
            local_308.m_backend.exp = 0;
            local_308.m_backend.neg = false;
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)&local_308,local_938);
            pTVar4 = (this->
                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     )._tolerances.
                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_9d8 = (this->
                        super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        )._tolerances.
                        super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
            if (local_9d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                local_9d8->_M_use_count = local_9d8->_M_use_count + 1;
                UNLOCK();
              }
              else {
                local_9d8->_M_use_count = local_9d8->_M_use_count + 1;
              }
            }
            RVar9 = Tolerances::epsilon(pTVar4);
            bVar20 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                               (&local_2b8,&local_308,RVar9);
          }
          else {
            bVar20 = false;
          }
          if (bVar19 && local_9d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_9d8);
          }
          if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
          }
          pnVar8 = local_968.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (bVar20 == false) {
            iVar21 = *(int *)((long)(&((pIVar6->data).
                                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      .m_elem)->val + 1) + lVar29);
            pnVar8 = (local_a30->
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).left.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_358.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar8[iVar21].m_backend.data;
            local_358.m_backend.data._M_elems._8_8_ =
                 *(undefined8 *)((long)&pnVar8[iVar21].m_backend.data + 8);
            puVar3 = (uint *)((long)&pnVar8[iVar21].m_backend.data + 0x10);
            local_358.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar3;
            local_358.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar3 + 2);
            puVar3 = (uint *)((long)&pnVar8[iVar21].m_backend.data + 0x20);
            local_358.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar3;
            local_358.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar3 + 2);
            puVar3 = (uint *)((long)&pnVar8[iVar21].m_backend.data + 0x30);
            local_358.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar3;
            local_358.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar3 + 2);
            local_358.m_backend.exp = pnVar8[iVar21].m_backend.exp;
            local_358.m_backend.neg = pnVar8[iVar21].m_backend.neg;
            local_358.m_backend.fpclass = pnVar8[iVar21].m_backend.fpclass;
            local_358.m_backend.prec_elem = pnVar8[iVar21].m_backend.prec_elem;
            ::soplex::infinity::__tls_init();
            local_3a8.m_backend.fpclass = cpp_dec_float_finite;
            local_3a8.m_backend.prec_elem = 0x10;
            local_3a8.m_backend.data._M_elems[0] = 0;
            local_3a8.m_backend.data._M_elems[1] = 0;
            local_3a8.m_backend.data._M_elems[2] = 0;
            local_3a8.m_backend.data._M_elems[3] = 0;
            local_3a8.m_backend.data._M_elems[4] = 0;
            local_3a8.m_backend.data._M_elems[5] = 0;
            local_3a8.m_backend.data._M_elems[6] = 0;
            local_3a8.m_backend.data._M_elems[7] = 0;
            local_3a8.m_backend.data._M_elems[8] = 0;
            local_3a8.m_backend.data._M_elems[9] = 0;
            local_3a8.m_backend.data._M_elems[10] = 0;
            local_3a8.m_backend.data._M_elems[0xb] = 0;
            local_3a8.m_backend.data._M_elems[0xc] = 0;
            local_3a8.m_backend.data._M_elems[0xd] = 0;
            local_3a8.m_backend.data._M_elems._56_5_ = 0;
            local_3a8.m_backend.data._M_elems[0xf]._1_3_ = 0;
            local_3a8.m_backend.exp = 0;
            local_3a8.m_backend.neg = false;
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)&local_3a8,
                       (double)CONCAT44(uStack_824,local_828));
            pTVar4 = (this->
                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     )._tolerances.
                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            p_Var5 = (this->
                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     )._tolerances.
                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi;
            if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
              }
            }
            RVar9 = Tolerances::epsilon(pTVar4);
            bVar19 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                               (&local_358,&local_3a8,RVar9);
            if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
            }
            if (bVar19) {
              if (local_a28.fpclass != cpp_dec_float_NaN) {
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                cpp_dec_float<long_long>(&local_a88,0,(type *)0x0);
                iVar21 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (&local_a28,&local_a88);
                pnVar8 = local_980.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                if (0 < iVar21) {
                  local_a88.fpclass = cpp_dec_float_finite;
                  local_a88.prec_elem = 0x10;
                  local_a88.data._M_elems[0] = 0;
                  local_a88.data._M_elems[1] = 0;
                  local_a88.data._M_elems[2] = 0;
                  local_a88.data._M_elems[3] = 0;
                  local_a88.data._M_elems[4] = 0;
                  local_a88.data._M_elems[5] = 0;
                  local_a88.data._M_elems[6] = 0;
                  local_a88.data._M_elems[7] = 0;
                  local_a88.data._M_elems[8] = 0;
                  local_a88.data._M_elems[9] = 0;
                  local_a88.data._M_elems[10] = 0;
                  local_a88.data._M_elems[0xb] = 0;
                  local_a88.data._M_elems[0xc] = 0;
                  local_a88.data._M_elems[0xd] = 0;
                  local_a88.data._M_elems._56_5_ = 0;
                  local_a88.data._M_elems[0xf]._1_3_ = 0;
                  local_a88.exp = 0;
                  local_a88.neg = false;
                  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                  from_unsigned_long_long(&local_a88,1);
                  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                            (&pnVar8[lVar1].m_backend,&local_a88);
                  goto LAB_004238c8;
                }
              }
              if (local_a28.fpclass != cpp_dec_float_NaN) {
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                cpp_dec_float<long_long>(&local_a88,0,(type *)0x0);
                iVar21 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (&local_a28,&local_a88);
                pnVar8 = local_968.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                if (iVar21 < 0) {
                  local_a88.fpclass = cpp_dec_float_finite;
                  local_a88.prec_elem = 0x10;
                  local_a88.data._M_elems[0] = 0;
                  local_a88.data._M_elems[1] = 0;
                  local_a88.data._M_elems[2] = 0;
                  local_a88.data._M_elems[3] = 0;
                  local_a88.data._M_elems[4] = 0;
                  local_a88.data._M_elems[5] = 0;
                  local_a88.data._M_elems[6] = 0;
                  local_a88.data._M_elems[7] = 0;
                  local_a88.data._M_elems[8] = 0;
                  local_a88.data._M_elems[9] = 0;
                  local_a88.data._M_elems[10] = 0;
                  local_a88.data._M_elems[0xb] = 0;
                  local_a88.data._M_elems[0xc] = 0;
                  local_a88.data._M_elems[0xd] = 0;
                  local_a88.data._M_elems._56_5_ = 0;
                  local_a88.data._M_elems[0xf]._1_3_ = 0;
                  local_a88.exp = 0;
                  local_a88.neg = false;
                  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                  from_unsigned_long_long(&local_a88,1);
                  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                            (&pnVar8[lVar1].m_backend,&local_a88);
                }
              }
            }
            else {
              iVar21 = *(int *)((long)(&((pIVar6->data).
                                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        .m_elem)->val + 1) + lVar29);
              pnVar8 = (local_a30->
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).right.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_3f8.m_backend.data._M_elems._0_8_ =
                   *(undefined8 *)&pnVar8[iVar21].m_backend.data;
              local_3f8.m_backend.data._M_elems._8_8_ =
                   *(undefined8 *)((long)&pnVar8[iVar21].m_backend.data + 8);
              puVar3 = (uint *)((long)&pnVar8[iVar21].m_backend.data + 0x10);
              local_3f8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar3;
              local_3f8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar3 + 2);
              puVar3 = (uint *)((long)&pnVar8[iVar21].m_backend.data + 0x20);
              local_3f8.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar3;
              local_3f8.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar3 + 2);
              puVar3 = (uint *)((long)&pnVar8[iVar21].m_backend.data + 0x30);
              local_3f8.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar3;
              local_3f8.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar3 + 2);
              local_3f8.m_backend.exp = pnVar8[iVar21].m_backend.exp;
              local_3f8.m_backend.neg = pnVar8[iVar21].m_backend.neg;
              local_3f8.m_backend.fpclass = pnVar8[iVar21].m_backend.fpclass;
              local_3f8.m_backend.prec_elem = pnVar8[iVar21].m_backend.prec_elem;
              ::soplex::infinity::__tls_init();
              local_448.m_backend.fpclass = cpp_dec_float_finite;
              local_448.m_backend.prec_elem = 0x10;
              local_448.m_backend.data._M_elems[0] = 0;
              local_448.m_backend.data._M_elems[1] = 0;
              local_448.m_backend.data._M_elems[2] = 0;
              local_448.m_backend.data._M_elems[3] = 0;
              local_448.m_backend.data._M_elems[4] = 0;
              local_448.m_backend.data._M_elems[5] = 0;
              local_448.m_backend.data._M_elems[6] = 0;
              local_448.m_backend.data._M_elems[7] = 0;
              local_448.m_backend.data._M_elems[8] = 0;
              local_448.m_backend.data._M_elems[9] = 0;
              local_448.m_backend.data._M_elems[10] = 0;
              local_448.m_backend.data._M_elems[0xb] = 0;
              local_448.m_backend.data._M_elems[0xc] = 0;
              local_448.m_backend.data._M_elems[0xd] = 0;
              local_448.m_backend.data._M_elems._56_5_ = 0;
              local_448.m_backend.data._M_elems[0xf]._1_3_ = 0;
              local_448.m_backend.exp = 0;
              local_448.m_backend.neg = false;
              boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                        ((cpp_dec_float<100u,int,void> *)&local_448,local_938);
              pTVar4 = (this->
                       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       )._tolerances.
                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              p_Var5 = (this->
                       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       )._tolerances.
                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
              if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
                }
              }
              RVar9 = Tolerances::epsilon(pTVar4);
              bVar19 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                                 (&local_3f8,&local_448,RVar9);
              if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
              }
              if (bVar19) {
                if (local_a28.fpclass != cpp_dec_float_NaN) {
                  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                  cpp_dec_float<long_long>(&local_a88,0,(type *)0x0);
                  iVar21 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     (&local_a28,&local_a88);
                  pnVar8 = local_968.val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  if (0 < iVar21) {
                    local_a88.fpclass = cpp_dec_float_finite;
                    local_a88.prec_elem = 0x10;
                    local_a88.data._M_elems[0] = 0;
                    local_a88.data._M_elems[1] = 0;
                    local_a88.data._M_elems[2] = 0;
                    local_a88.data._M_elems[3] = 0;
                    local_a88.data._M_elems[4] = 0;
                    local_a88.data._M_elems[5] = 0;
                    local_a88.data._M_elems[6] = 0;
                    local_a88.data._M_elems[7] = 0;
                    local_a88.data._M_elems[8] = 0;
                    local_a88.data._M_elems[9] = 0;
                    local_a88.data._M_elems[10] = 0;
                    local_a88.data._M_elems[0xb] = 0;
                    local_a88.data._M_elems[0xc] = 0;
                    local_a88.data._M_elems[0xd] = 0;
                    local_a88.data._M_elems._56_5_ = 0;
                    local_a88.data._M_elems[0xf]._1_3_ = 0;
                    local_a88.exp = 0;
                    local_a88.neg = false;
                    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                    from_unsigned_long_long(&local_a88,1);
                    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                              (&pnVar8[lVar1].m_backend,&local_a88);
                    goto LAB_004238c8;
                  }
                }
                if (local_a28.fpclass != cpp_dec_float_NaN) {
                  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                  cpp_dec_float<long_long>(&local_a88,0,(type *)0x0);
                  iVar21 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     (&local_a28,&local_a88);
                  pnVar8 = local_980.val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  if (iVar21 < 0) {
                    local_a88.fpclass = cpp_dec_float_finite;
                    local_a88.prec_elem = 0x10;
                    local_a88.data._M_elems[0] = 0;
                    local_a88.data._M_elems[1] = 0;
                    local_a88.data._M_elems[2] = 0;
                    local_a88.data._M_elems[3] = 0;
                    local_a88.data._M_elems[4] = 0;
                    local_a88.data._M_elems[5] = 0;
                    local_a88.data._M_elems[6] = 0;
                    local_a88.data._M_elems[7] = 0;
                    local_a88.data._M_elems[8] = 0;
                    local_a88.data._M_elems[9] = 0;
                    local_a88.data._M_elems[10] = 0;
                    local_a88.data._M_elems[0xb] = 0;
                    local_a88.data._M_elems[0xc] = 0;
                    local_a88.data._M_elems[0xd] = 0;
                    local_a88.data._M_elems._56_5_ = 0;
                    local_a88.data._M_elems[0xf]._1_3_ = 0;
                    local_a88.exp = 0;
                    local_a88.neg = false;
                    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                    from_unsigned_long_long(&local_a88,1);
                    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                              (&pnVar8[lVar1].m_backend,&local_a88);
                  }
                }
              }
            }
          }
          else {
            local_a88.fpclass = cpp_dec_float_finite;
            local_a88.prec_elem = 0x10;
            local_a88.data._M_elems[0] = 0;
            local_a88.data._M_elems[1] = 0;
            local_a88.data._M_elems[2] = 0;
            local_a88.data._M_elems[3] = 0;
            local_a88.data._M_elems[4] = 0;
            local_a88.data._M_elems[5] = 0;
            local_a88.data._M_elems[6] = 0;
            local_a88.data._M_elems[7] = 0;
            local_a88.data._M_elems[8] = 0;
            local_a88.data._M_elems[9] = 0;
            local_a88.data._M_elems[10] = 0;
            local_a88.data._M_elems[0xb] = 0;
            local_a88.data._M_elems[0xc] = 0;
            local_a88.data._M_elems[0xd] = 0;
            local_a88.data._M_elems._56_5_ = 0;
            local_a88.data._M_elems[0xf]._1_3_ = 0;
            local_a88.exp = 0;
            local_a88.neg = false;
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::from_unsigned_long_long
                      (&local_a88,1);
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                      (&pnVar8[lVar1].m_backend,&local_a88);
            pnVar8 = local_980.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_a88.fpclass = cpp_dec_float_finite;
            local_a88.prec_elem = 0x10;
            local_a88.data._M_elems[0] = 0;
            local_a88.data._M_elems[1] = 0;
            local_a88.data._M_elems[2] = 0;
            local_a88.data._M_elems[3] = 0;
            local_a88.data._M_elems[4] = 0;
            local_a88.data._M_elems[5] = 0;
            local_a88.data._M_elems[6] = 0;
            local_a88.data._M_elems[7] = 0;
            local_a88.data._M_elems[8] = 0;
            local_a88.data._M_elems[9] = 0;
            local_a88.data._M_elems[10] = 0;
            local_a88.data._M_elems[0xb] = 0;
            local_a88.data._M_elems[0xc] = 0;
            local_a88.data._M_elems[0xd] = 0;
            local_a88.data._M_elems._56_5_ = 0;
            local_a88.data._M_elems[0xf]._1_3_ = 0;
            local_a88.exp = 0;
            local_a88.neg = false;
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::from_unsigned_long_long
                      (&local_a88,1);
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                      (&pnVar8[lVar1].m_backend,&local_a88);
          }
LAB_004238c8:
          lVar27 = lVar27 + 1;
          lVar29 = lVar29 + 0x54;
        } while (lVar27 < (pIVar6->data).
                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .memused);
      }
      lVar27 = local_920;
      pnVar8 = (local_a30->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).low.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar26 = pnVar8[local_920].m_backend.data._M_elems[0];
      puVar3 = (uint *)((long)&pnVar8[local_920].m_backend.data + 0x30);
      auStack_994._0_8_ = *(undefined8 *)(puVar3 + 2);
      uStack_998 = (uint)((ulong)*(undefined8 *)puVar3 >> 0x20);
      puVar3 = (uint *)((long)&pnVar8[local_920].m_backend.data + 0x24);
      auStack_9a8 = *(uint (*) [2])puVar3;
      uVar10 = *(undefined8 *)(puVar3 + 2);
      uStack_9a0 = (uint)uVar10;
      local_99c = (uint)((ulong)uVar10 >> 0x20);
      puVar3 = (uint *)((long)&pnVar8[local_920].m_backend.data + 0x14);
      local_9b8 = *(uint (*) [2])puVar3;
      auStack_9b0 = *(uint (*) [2])(puVar3 + 2);
      puVar3 = (uint *)((long)&pnVar8[local_920].m_backend.data + 4);
      local_9c8 = *(uint (*) [2])puVar3;
      auStack_9c0 = *(uint (*) [2])(puVar3 + 2);
      local_a8c = pnVar8[local_920].m_backend.exp;
      bVar24 = pnVar8[local_920].m_backend.neg;
      fVar28 = pnVar8[local_920].m_backend.fpclass;
      local_a90 = pnVar8[local_920].m_backend.prec_elem;
      pnVar8 = (local_a30->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).up.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar10 = *(undefined8 *)&pnVar8[local_920].m_backend.data;
      uVar11 = *(undefined8 *)((long)&pnVar8[local_920].m_backend.data + 8);
      puVar3 = (uint *)((long)&pnVar8[local_920].m_backend.data + 0x10);
      uVar12 = *(undefined8 *)puVar3;
      uVar13 = *(undefined8 *)(puVar3 + 2);
      puVar3 = (uint *)((long)&pnVar8[local_920].m_backend.data + 0x20);
      uVar14 = *(undefined8 *)puVar3;
      uVar15 = *(undefined8 *)(puVar3 + 2);
      puVar3 = (uint *)((long)&pnVar8[local_920].m_backend.data + 0x30);
      uVar16 = *(undefined8 *)puVar3;
      uVar17 = *(undefined8 *)(puVar3 + 2);
      local_a28.data._M_elems[0xc] = (uint)uVar16;
      local_a28.data._M_elems[0xd] = (uint)((ulong)uVar16 >> 0x20);
      local_a28.data._M_elems._56_5_ = SUB85(uVar17,0);
      local_a28.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar17 >> 0x28);
      local_a28.data._M_elems[8] = (uint)uVar14;
      local_a28.data._M_elems[9] = (uint)((ulong)uVar14 >> 0x20);
      local_a28.data._M_elems[10] = (uint)uVar15;
      local_a28.data._M_elems[0xb] = (uint)((ulong)uVar15 >> 0x20);
      local_a28.data._M_elems[4] = (uint)uVar12;
      local_a28.data._M_elems[5] = (uint)((ulong)uVar12 >> 0x20);
      local_a28.data._M_elems[6] = (uint)uVar13;
      local_a28.data._M_elems[7] = (uint)((ulong)uVar13 >> 0x20);
      local_a28.data._M_elems[0] = (uint)uVar10;
      local_a28.data._M_elems[1] = (uint)((ulong)uVar10 >> 0x20);
      local_a28.data._M_elems[2] = (uint)uVar11;
      local_a28.data._M_elems[3] = (uint)((ulong)uVar11 >> 0x20);
      local_a28.exp = pnVar8[local_920].m_backend.exp;
      local_a28.neg = pnVar8[local_920].m_backend.neg;
      local_a28.fpclass = pnVar8[local_920].m_backend.fpclass;
      local_a28.prec_elem = pnVar8[local_920].m_backend.prec_elem;
      local_178.m_backend.data._M_elems[0xd] = uStack_998;
      local_178.m_backend.data._M_elems[0] = uVar26;
      local_178.m_backend.data._M_elems._4_8_ = local_9c8;
      local_178.m_backend.data._M_elems._12_8_ = auStack_9c0;
      local_178.m_backend.data._M_elems._20_8_ = local_9b8;
      local_178.m_backend.data._M_elems._28_8_ = auStack_9b0;
      local_178.m_backend.data._M_elems._36_8_ = auStack_9a8;
      local_178.m_backend.data._M_elems[0xb] = uStack_9a0;
      local_178.m_backend.data._M_elems[0xc] = local_99c;
      local_178.m_backend.data._M_elems._56_8_ = auStack_994._0_8_;
      local_178.m_backend.exp = local_a8c;
      local_178.m_backend.neg = (bool)bVar24;
      local_178.m_backend.fpclass = fVar28;
      local_178.m_backend.prec_elem = local_a90;
      ::soplex::infinity::__tls_init();
      local_498.m_backend.fpclass = cpp_dec_float_finite;
      local_498.m_backend.prec_elem = 0x10;
      local_498.m_backend.data._M_elems[0] = 0;
      local_498.m_backend.data._M_elems[1] = 0;
      local_498.m_backend.data._M_elems[2] = 0;
      local_498.m_backend.data._M_elems[3] = 0;
      local_498.m_backend.data._M_elems[4] = 0;
      local_498.m_backend.data._M_elems[5] = 0;
      local_498.m_backend.data._M_elems[6] = 0;
      local_498.m_backend.data._M_elems[7] = 0;
      local_498.m_backend.data._M_elems[8] = 0;
      local_498.m_backend.data._M_elems[9] = 0;
      local_498.m_backend.data._M_elems[10] = 0;
      local_498.m_backend.data._M_elems[0xb] = 0;
      local_498.m_backend.data._M_elems[0xc] = 0;
      local_498.m_backend.data._M_elems[0xd] = 0;
      local_498.m_backend.data._M_elems._56_5_ = 0;
      local_498.m_backend.data._M_elems[0xf]._1_3_ = 0;
      local_498.m_backend.exp = 0;
      local_498.m_backend.neg = false;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_498,(double)CONCAT44(uStack_824,local_828));
      pTVar4 = (this->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      p_Var5 = (this->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
        }
      }
      RVar9 = Tolerances::epsilon(pTVar4);
      bVar19 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                         (&local_178,&local_498,RVar9);
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
      }
      if (bVar19) {
        local_a88.data._M_elems[0] = local_898.data._M_elems[0];
        local_a88.data._M_elems[1] = local_898.data._M_elems[1];
        local_a88.data._M_elems[2] = local_898.data._M_elems[2];
        local_a88.data._M_elems[3] = local_898.data._M_elems[3];
        local_a88.data._M_elems[0xc] = local_898.data._M_elems[0xc];
        local_a88.data._M_elems[0xd] = local_898.data._M_elems[0xd];
        local_a88.data._M_elems._56_5_ = local_898.data._M_elems._56_5_;
        local_a88.data._M_elems[0xf]._1_3_ = local_898.data._M_elems[0xf]._1_3_;
        local_a88.data._M_elems[8] = local_898.data._M_elems[8];
        local_a88.data._M_elems[9] = local_898.data._M_elems[9];
        local_a88.data._M_elems[10] = local_898.data._M_elems[10];
        local_a88.data._M_elems[0xb] = local_898.data._M_elems[0xb];
        local_a88.data._M_elems[4] = local_898.data._M_elems[4];
        local_a88.data._M_elems[5] = local_898.data._M_elems[5];
        local_a88.data._M_elems[6] = local_898.data._M_elems[6];
        local_a88.data._M_elems[7] = local_898.data._M_elems[7];
        local_a88.exp = local_898.exp;
        local_a88.neg = local_898.neg;
        local_a88.fpclass = local_898.fpclass;
        local_a88.prec_elem = local_898.prec_elem;
        if (local_898.data._M_elems[0] != 0 || local_898.fpclass != cpp_dec_float_finite) {
          local_a88.neg = (bool)(local_898.neg ^ 1);
        }
        if (((local_898.fpclass == cpp_dec_float_NaN) || (local_a28.fpclass == cpp_dec_float_NaN))
           || (iVar21 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                  (&local_a88,&local_a28), -1 < iVar21)) {
          local_a8c = local_a28.exp;
          local_918.data._M_elems[1] = local_a28.data._M_elems[2];
          local_918.data._M_elems[0] = local_a28.data._M_elems[1];
          local_918.data._M_elems[3] = local_a28.data._M_elems[4];
          local_918.data._M_elems[2] = local_a28.data._M_elems[3];
          local_918.data._M_elems[5] = local_a28.data._M_elems[6];
          local_918.data._M_elems[4] = local_a28.data._M_elems[5];
          local_918.data._M_elems[7] = local_a28.data._M_elems[8];
          local_918.data._M_elems[6] = local_a28.data._M_elems[7];
          local_918.data._M_elems[9] = local_a28.data._M_elems[10];
          local_918.data._M_elems[8] = local_a28.data._M_elems[9];
          local_918.data._M_elems[10] = local_a28.data._M_elems[0xb];
          local_918.data._M_elems[0xb] = local_a28.data._M_elems[0xc];
          local_918.data._M_elems[0xc] = local_a28.data._M_elems[0xd];
          local_918.data._M_elems[0xd] = local_a28.data._M_elems[0xe];
          local_918.data._M_elems[0xe] =
               (uint)(CONCAT35(local_a28.data._M_elems[0xf]._1_3_,local_a28.data._M_elems._56_5_) >>
                     0x20);
          local_a90 = local_a28.prec_elem;
          uVar26 = local_a28.data._M_elems[0];
          bVar24 = local_a28.neg;
          fVar28 = local_a28.fpclass;
        }
        else {
          local_a8c = local_898.exp;
          local_918.data._M_elems[1] = local_898.data._M_elems[2];
          local_918.data._M_elems[0] = local_898.data._M_elems[1];
          local_918.data._M_elems[3] = local_898.data._M_elems[4];
          local_918.data._M_elems[2] = local_898.data._M_elems[3];
          local_918.data._M_elems[5] = local_898.data._M_elems[6];
          local_918.data._M_elems[4] = local_898.data._M_elems[5];
          local_918.data._M_elems[7] = local_898.data._M_elems[8];
          local_918.data._M_elems[6] = local_898.data._M_elems[7];
          local_918.data._M_elems[9] = local_898.data._M_elems[10];
          local_918.data._M_elems[8] = local_898.data._M_elems[9];
          local_918.data._M_elems[10] = local_898.data._M_elems[0xb];
          local_918.data._M_elems[0xb] = local_898.data._M_elems[0xc];
          local_918.data._M_elems[0xc] = local_898.data._M_elems[0xd];
          local_918.data._M_elems[0xd] = local_898.data._M_elems[0xe];
          local_918.data._M_elems[0xe] =
               (uint)(CONCAT35(local_898.data._M_elems[0xf]._1_3_,local_898.data._M_elems._56_5_) >>
                     0x20);
          local_a90 = local_898.prec_elem;
          bVar24 = (local_898.data._M_elems[0] != 0 || local_898.fpclass != cpp_dec_float_finite) ^
                   local_898.neg;
          uVar26 = local_898.data._M_elems[0];
          fVar28 = local_898.fpclass;
        }
        auStack_994[1] = local_918.data._M_elems[0xe];
        auStack_994[0] = local_918.data._M_elems[0xd];
        uStack_998 = local_918.data._M_elems[0xc];
        auStack_9a8[0] = local_918.data._M_elems[8];
        auStack_9a8[1] = local_918.data._M_elems[9];
        uStack_9a0 = local_918.data._M_elems[10];
        local_99c = local_918.data._M_elems[0xb];
        local_9b8[0] = local_918.data._M_elems[4];
        local_9b8[1] = local_918.data._M_elems[5];
        auStack_9b0[0] = local_918.data._M_elems[6];
        auStack_9b0[1] = local_918.data._M_elems[7];
        local_9c8[0] = local_918.data._M_elems[0];
        local_9c8[1] = local_918.data._M_elems[1];
        auStack_9c0[0] = local_918.data._M_elems[2];
        auStack_9c0[1] = local_918.data._M_elems[3];
      }
      local_4e8.m_backend.data._M_elems[1] = local_a28.data._M_elems[1];
      local_4e8.m_backend.data._M_elems[0] = local_a28.data._M_elems[0];
      local_4e8.m_backend.data._M_elems[3] = local_a28.data._M_elems[3];
      local_4e8.m_backend.data._M_elems[2] = local_a28.data._M_elems[2];
      local_4e8.m_backend.data._M_elems[5] = local_a28.data._M_elems[5];
      local_4e8.m_backend.data._M_elems[4] = local_a28.data._M_elems[4];
      local_4e8.m_backend.data._M_elems[7] = local_a28.data._M_elems[7];
      local_4e8.m_backend.data._M_elems[6] = local_a28.data._M_elems[6];
      local_4e8.m_backend.data._M_elems[9] = local_a28.data._M_elems[9];
      local_4e8.m_backend.data._M_elems[8] = local_a28.data._M_elems[8];
      local_4e8.m_backend.data._M_elems[0xb] = local_a28.data._M_elems[0xb];
      local_4e8.m_backend.data._M_elems[10] = local_a28.data._M_elems[10];
      local_4e8.m_backend.data._M_elems[0xd] = local_a28.data._M_elems[0xd];
      local_4e8.m_backend.data._M_elems[0xc] = local_a28.data._M_elems[0xc];
      local_4e8.m_backend.data._M_elems[0xf]._1_3_ = local_a28.data._M_elems[0xf]._1_3_;
      local_4e8.m_backend.data._M_elems._56_5_ = local_a28.data._M_elems._56_5_;
      local_4e8.m_backend.exp = local_a28.exp;
      local_4e8.m_backend.neg = local_a28.neg;
      local_4e8.m_backend.fpclass = local_a28.fpclass;
      local_4e8.m_backend.prec_elem = local_a28.prec_elem;
      ::soplex::infinity::__tls_init();
      local_538.m_backend.fpclass = cpp_dec_float_finite;
      local_538.m_backend.prec_elem = 0x10;
      local_538.m_backend.data._M_elems[0] = 0;
      local_538.m_backend.data._M_elems[1] = 0;
      local_538.m_backend.data._M_elems[2] = 0;
      local_538.m_backend.data._M_elems[3] = 0;
      local_538.m_backend.data._M_elems[4] = 0;
      local_538.m_backend.data._M_elems[5] = 0;
      local_538.m_backend.data._M_elems[6] = 0;
      local_538.m_backend.data._M_elems[7] = 0;
      local_538.m_backend.data._M_elems[8] = 0;
      local_538.m_backend.data._M_elems[9] = 0;
      local_538.m_backend.data._M_elems[10] = 0;
      local_538.m_backend.data._M_elems[0xb] = 0;
      local_538.m_backend.data._M_elems[0xc] = 0;
      local_538.m_backend.data._M_elems[0xd] = 0;
      local_538.m_backend.data._M_elems._56_5_ = 0;
      local_538.m_backend.data._M_elems[0xf]._1_3_ = 0;
      local_538.m_backend.exp = 0;
      local_538.m_backend.neg = false;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_538,local_938);
      pTVar4 = (this->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      p_Var5 = (this->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
        }
      }
      RVar9 = Tolerances::epsilon(pTVar4);
      bVar19 = GE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                         (&local_4e8,&local_538,RVar9);
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
      }
      if (bVar19) {
        pnVar8 = (local_a30->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).low.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pcVar23 = &local_898;
        if ((pnVar8[lVar1].m_backend.fpclass != cpp_dec_float_NaN) &&
           (local_898.fpclass != cpp_dec_float_NaN)) {
          iVar21 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             (&pnVar8[lVar1].m_backend,pcVar23);
          pcVar23 = &local_898;
          if (0 < iVar21) {
            pcVar23 = &(local_a30->
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).low.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend;
          }
        }
        uVar10 = *(undefined8 *)(pcVar23->data)._M_elems;
        uVar11 = *(undefined8 *)((pcVar23->data)._M_elems + 2);
        uVar12 = *(undefined8 *)((pcVar23->data)._M_elems + 4);
        uVar13 = *(undefined8 *)((pcVar23->data)._M_elems + 6);
        uVar14 = *(undefined8 *)((pcVar23->data)._M_elems + 8);
        uVar15 = *(undefined8 *)((pcVar23->data)._M_elems + 10);
        uVar16 = *(undefined8 *)((pcVar23->data)._M_elems + 0xc);
        uVar17 = *(undefined8 *)((pcVar23->data)._M_elems + 0xe);
        local_a28.data._M_elems[0xc] = (uint)uVar16;
        local_a28.data._M_elems[0xd] = (uint)((ulong)uVar16 >> 0x20);
        local_a28.data._M_elems._56_5_ = SUB85(uVar17,0);
        local_a28.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar17 >> 0x28);
        local_a28.data._M_elems[8] = (uint)uVar14;
        local_a28.data._M_elems[9] = (uint)((ulong)uVar14 >> 0x20);
        local_a28.data._M_elems[10] = (uint)uVar15;
        local_a28.data._M_elems[0xb] = (uint)((ulong)uVar15 >> 0x20);
        local_a28.data._M_elems[4] = (uint)uVar12;
        local_a28.data._M_elems[5] = (uint)((ulong)uVar12 >> 0x20);
        local_a28.data._M_elems[6] = (uint)uVar13;
        local_a28.data._M_elems[7] = (uint)((ulong)uVar13 >> 0x20);
        local_a28.data._M_elems[0] = (uint)uVar10;
        local_a28.data._M_elems[1] = (uint)((ulong)uVar10 >> 0x20);
        local_a28.data._M_elems[2] = (uint)uVar11;
        local_a28.data._M_elems[3] = (uint)((ulong)uVar11 >> 0x20);
        local_a28.exp = pcVar23->exp;
        local_a28.neg = pcVar23->neg;
        local_a28.fpclass = pcVar23->fpclass;
        local_a28.prec_elem = pcVar23->prec_elem;
      }
      if (bVar18) {
        local_588.fpclass = cpp_dec_float_finite;
        local_588.prec_elem = 0x10;
        local_588.data._M_elems[0] = 0;
        local_588.data._M_elems[1] = 0;
        local_588.data._M_elems[2] = 0;
        local_588.data._M_elems[3] = 0;
        local_588.data._M_elems[4] = 0;
        local_588.data._M_elems[5] = 0;
        local_588.data._M_elems[6] = 0;
        local_588.data._M_elems[7] = 0;
        local_588.data._M_elems[8] = 0;
        local_588.data._M_elems[9] = 0;
        local_588.data._M_elems[10] = 0;
        local_588.data._M_elems[0xb] = 0;
        local_588.data._M_elems[0xc] = 0;
        local_588.data._M_elems[0xd] = 0;
        local_588.data._M_elems._56_5_ = 0;
        local_588.data._M_elems[0xf]._1_3_ = 0;
        local_588.exp = 0;
        local_588.neg = false;
        boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                  ((cpp_dec_float<100u,int,void> *)&local_588,0.0);
        feastol((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)&local_128,this);
        local_a88.data._M_elems[0xd] = uStack_998;
        local_a88.data._M_elems._56_5_ = SUB85(auStack_994._0_8_,0);
        local_a88.data._M_elems[0xf]._1_3_ = SUB83(auStack_994._0_8_,5);
        local_a88.data._M_elems[9] = auStack_9a8[0];
        local_a88.data._M_elems[10] = auStack_9a8[1];
        local_a88.data._M_elems[0xb] = uStack_9a0;
        local_a88.data._M_elems[0xc] = local_99c;
        local_a88.data._M_elems[5] = local_9b8[0];
        local_a88.data._M_elems[6] = local_9b8[1];
        local_a88.data._M_elems[7] = auStack_9b0[0];
        local_a88.data._M_elems[8] = auStack_9b0[1];
        local_a88.data._M_elems[1] = local_9c8[0];
        local_a88.data._M_elems[2] = local_9c8[1];
        local_a88.data._M_elems[3] = auStack_9c0[0];
        local_a88.data._M_elems[4] = auStack_9c0[1];
        local_a88.exp = local_a8c;
        local_a88.prec_elem = local_a90;
        local_a88.fpclass = fVar28;
        local_a88.data._M_elems[0] = uVar26;
        local_a88.neg = (bool)bVar24;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                  (&local_a88,&local_588);
        if (((local_a88.fpclass != cpp_dec_float_NaN) && (local_128.fpclass != cpp_dec_float_NaN))
           && (iVar21 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                  (&local_a88,&local_128), iVar21 < 0)) {
          local_5d8.m_backend.data._M_elems[1] = local_a28.data._M_elems[1];
          local_5d8.m_backend.data._M_elems[0] = local_a28.data._M_elems[0];
          local_5d8.m_backend.data._M_elems[3] = local_a28.data._M_elems[3];
          local_5d8.m_backend.data._M_elems[2] = local_a28.data._M_elems[2];
          local_5d8.m_backend.data._M_elems[5] = local_a28.data._M_elems[5];
          local_5d8.m_backend.data._M_elems[4] = local_a28.data._M_elems[4];
          local_5d8.m_backend.data._M_elems[7] = local_a28.data._M_elems[7];
          local_5d8.m_backend.data._M_elems[6] = local_a28.data._M_elems[6];
          local_5d8.m_backend.data._M_elems[9] = local_a28.data._M_elems[9];
          local_5d8.m_backend.data._M_elems[8] = local_a28.data._M_elems[8];
          local_5d8.m_backend.data._M_elems[0xb] = local_a28.data._M_elems[0xb];
          local_5d8.m_backend.data._M_elems[10] = local_a28.data._M_elems[10];
          local_5d8.m_backend.data._M_elems[0xd] = local_a28.data._M_elems[0xd];
          local_5d8.m_backend.data._M_elems[0xc] = local_a28.data._M_elems[0xc];
          local_5d8.m_backend.data._M_elems[0xf]._1_3_ = local_a28.data._M_elems[0xf]._1_3_;
          local_5d8.m_backend.data._M_elems._56_5_ = local_a28.data._M_elems._56_5_;
          local_5d8.m_backend.exp = local_a28.exp;
          local_5d8.m_backend.neg = local_a28.neg;
          local_5d8.m_backend.fpclass = local_a28.fpclass;
          local_5d8.m_backend.prec_elem = local_a28.prec_elem;
          local_628.m_backend.fpclass = cpp_dec_float_finite;
          local_628.m_backend.data._M_elems[0] = 0;
          local_628.m_backend.data._M_elems[1] = 0;
          local_628.m_backend.data._M_elems[2] = 0;
          local_628.m_backend.data._M_elems[3] = 0;
          local_628.m_backend.data._M_elems[4] = 0;
          local_628.m_backend.data._M_elems[5] = 0;
          local_628.m_backend.data._M_elems[6] = 0;
          local_628.m_backend.data._M_elems[7] = 0;
          local_628.m_backend.data._M_elems[8] = 0;
          local_628.m_backend.data._M_elems[9] = 0;
          local_628.m_backend.data._M_elems[10] = 0;
          local_628.m_backend.data._M_elems[0xb] = 0;
          local_628.m_backend.data._M_elems[0xc] = 0;
          local_628.m_backend.data._M_elems[0xd] = 0;
          local_628.m_backend.data._M_elems._56_5_ = 0;
          local_628.m_backend.data._M_elems[0xf]._1_3_ = 0;
          local_628.m_backend.exp = 0;
          local_628.m_backend.neg = false;
          local_628.m_backend.prec_elem = 0x10;
          boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                    ((cpp_dec_float<100u,int,void> *)&local_628,0.0);
          feastol(&local_80,this);
          bVar19 = GE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                             (&local_5d8,&local_628,&local_80);
          if (bVar19) {
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)
                       (local_840.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar1),0.0);
            goto LAB_004244ad;
          }
        }
        bVar18 = false;
      }
LAB_004244ad:
      local_8b0.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar27].m_backend.data._M_elems[0] = uVar26;
      puVar3 = local_8b0.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar27].m_backend.data._M_elems + 1;
      *(uint (*) [2])puVar3 = local_9c8;
      *(uint (*) [2])(puVar3 + 2) = auStack_9c0;
      puVar3 = local_8b0.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar27].m_backend.data._M_elems + 5;
      *(uint (*) [2])puVar3 = local_9b8;
      *(uint (*) [2])(puVar3 + 2) = auStack_9b0;
      puVar3 = local_8b0.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar27].m_backend.data._M_elems + 9;
      *(uint (*) [2])puVar3 = auStack_9a8;
      *(ulong *)(puVar3 + 2) = CONCAT44(local_99c,uStack_9a0);
      puVar3 = local_8b0.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar27].m_backend.data._M_elems + 0xc;
      *(ulong *)puVar3 = CONCAT44(uStack_998,local_99c);
      *(undefined8 *)(puVar3 + 2) = auStack_994._0_8_;
      local_8b0.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar27].m_backend.exp = local_a8c;
      local_8b0.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar27].m_backend.neg = (bool)bVar24;
      local_8b0.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar27].m_backend.fpclass = fVar28;
      local_8b0.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar27].m_backend.prec_elem = local_a90;
      puVar3 = local_8c8.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar27].m_backend.data._M_elems + 0xc;
      *(ulong *)puVar3 = CONCAT44(local_a28.data._M_elems[0xd],local_a28.data._M_elems[0xc]);
      *(ulong *)(puVar3 + 2) =
           CONCAT35(local_a28.data._M_elems[0xf]._1_3_,local_a28.data._M_elems._56_5_);
      puVar3 = local_8c8.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar27].m_backend.data._M_elems + 8;
      *(ulong *)puVar3 = CONCAT44(local_a28.data._M_elems[9],local_a28.data._M_elems[8]);
      *(ulong *)(puVar3 + 2) = CONCAT44(local_a28.data._M_elems[0xb],local_a28.data._M_elems[10]);
      puVar3 = local_8c8.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar27].m_backend.data._M_elems + 4;
      *(ulong *)puVar3 = CONCAT44(local_a28.data._M_elems[5],local_a28.data._M_elems[4]);
      *(ulong *)(puVar3 + 2) = CONCAT44(local_a28.data._M_elems[7],local_a28.data._M_elems[6]);
      *(ulong *)local_8c8.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar27].m_backend.data._M_elems =
           CONCAT44(local_a28.data._M_elems[1],local_a28.data._M_elems[0]);
      *(ulong *)(local_8c8.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar27].m_backend.data._M_elems + 2) =
           CONCAT44(local_a28.data._M_elems[3],local_a28.data._M_elems[2]);
      local_8c8.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar27].m_backend.exp = local_a28.exp;
      local_8c8.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar27].m_backend.neg = local_a28.neg;
      local_8c8.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar27].m_backend.fpclass = local_a28.fpclass;
      local_8c8.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar27].m_backend.prec_elem = local_a28.prec_elem;
      if (((local_980.val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar27].m_backend.fpclass == cpp_dec_float_NaN
           ) || (local_968.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar27].m_backend.fpclass ==
                 cpp_dec_float_NaN)) ||
         (iVar21 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             (&local_980.val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar27].m_backend,
                              &local_968.val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar27].m_backend),
         iVar21 < 1)) {
        if (((local_980.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar27].m_backend.fpclass ==
              cpp_dec_float_NaN) ||
            (local_968.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar27].m_backend.fpclass ==
             cpp_dec_float_NaN)) ||
           (iVar21 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               (&local_980.val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[lVar27].m_backend,
                                &local_968.val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[lVar27].m_backend),
           -1 < iVar21)) {
          local_678.data._M_elems[0xd] = uStack_998;
          local_678.data._M_elems._56_5_ = SUB85(auStack_994._0_8_,0);
          local_678.data._M_elems[0xf]._1_3_ = SUB83(auStack_994._0_8_,5);
          local_678.data._M_elems[9] = auStack_9a8[0];
          local_678.data._M_elems[10] = auStack_9a8[1];
          local_678.data._M_elems[0xb] = uStack_9a0;
          local_678.data._M_elems[0xc] = local_99c;
          local_678.data._M_elems[5] = local_9b8[0];
          local_678.data._M_elems[6] = local_9b8[1];
          local_678.data._M_elems[7] = auStack_9b0[0];
          local_678.data._M_elems[8] = auStack_9b0[1];
          local_678.data._M_elems[1] = local_9c8[0];
          local_678.data._M_elems[2] = local_9c8[1];
          local_678.data._M_elems[3] = auStack_9c0[0];
          local_678.data._M_elems[4] = auStack_9c0[1];
          local_678.exp = local_a8c;
          local_678.prec_elem = local_a90;
          local_678.fpclass = fVar28;
          local_678.data._M_elems[0] = uVar26;
          local_678.neg = (bool)bVar24;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                    (&local_678,&local_a28);
          local_918.fpclass = cpp_dec_float_finite;
          local_918.prec_elem = 0x10;
          local_918.data._M_elems[0] = 0;
          local_918.data._M_elems[1] = 0;
          local_918.data._M_elems[2] = 0;
          local_918.data._M_elems[3] = 0;
          local_918.data._M_elems[4] = 0;
          local_918.data._M_elems[5] = 0;
          local_918.data._M_elems[6] = 0;
          local_918.data._M_elems[7] = 0;
          local_918.data._M_elems[8] = 0;
          local_918.data._M_elems[9] = 0;
          local_918.data._M_elems[10] = 0;
          local_918.data._M_elems[0xb] = 0;
          local_918.data._M_elems[0xc] = 0;
          local_918.data._M_elems[0xd] = 0;
          local_918.data._M_elems[0xe] = 0;
          local_918.data._M_elems[0xf] = 0;
          local_918.exp = 0;
          local_918.neg = false;
          local_a88.fpclass = cpp_dec_float_finite;
          local_a88.prec_elem = 0x10;
          local_a88.data._M_elems[0] = 0;
          local_a88.data._M_elems[1] = 0;
          local_a88.data._M_elems[2] = 0;
          local_a88.data._M_elems[3] = 0;
          local_a88.data._M_elems[4] = 0;
          local_a88.data._M_elems[5] = 0;
          local_a88.data._M_elems[6] = 0;
          local_a88.data._M_elems[7] = 0;
          local_a88.data._M_elems[8] = 0;
          local_a88.data._M_elems[9] = 0;
          local_a88.data._M_elems[10] = 0;
          local_a88.data._M_elems[0xb] = 0;
          local_a88.data._M_elems[0xc] = 0;
          local_a88.data._M_elems[0xd] = 0;
          local_a88.data._M_elems._56_5_ = 0;
          local_a88.data._M_elems[0xf]._1_3_ = 0;
          local_a88.exp = 0;
          local_a88.neg = false;
          boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                    ((cpp_dec_float<100u,int,void> *)&local_a88,2.0);
          lVar29 = local_9d0;
          lp = local_a30;
          boost::multiprecision::default_ops::
          eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    (&local_918,&local_678,&local_a88);
          puVar3 = local_950.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.data._M_elems + 0xc;
          *(ulong *)puVar3 = CONCAT44(local_918.data._M_elems[0xd],local_918.data._M_elems[0xc]);
          *(ulong *)(puVar3 + 2) =
               CONCAT44(local_918.data._M_elems[0xf],local_918.data._M_elems[0xe]);
          puVar3 = local_950.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.data._M_elems + 8;
          *(undefined8 *)puVar3 = local_918.data._M_elems._32_8_;
          *(ulong *)(puVar3 + 2) =
               CONCAT44(local_918.data._M_elems[0xb],local_918.data._M_elems[10]);
          puVar3 = local_950.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.data._M_elems + 4;
          *(undefined8 *)puVar3 = local_918.data._M_elems._16_8_;
          *(undefined8 *)(puVar3 + 2) = local_918.data._M_elems._24_8_;
          *(undefined8 *)
           local_950.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.data._M_elems =
               local_918.data._M_elems._0_8_;
          *(undefined8 *)
           (local_950.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.data._M_elems + 2) =
               local_918.data._M_elems._8_8_;
          local_950.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.exp = local_918.exp;
          local_950.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.neg = local_918.neg;
          local_950.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.fpclass = local_918.fpclass;
          local_950.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.prec_elem = local_918.prec_elem
          ;
        }
        else {
          local_950.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.data._M_elems[0] = uVar26;
          puVar3 = local_950.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.data._M_elems + 1;
          *(uint (*) [2])puVar3 = local_9c8;
          *(uint (*) [2])(puVar3 + 2) = auStack_9c0;
          puVar3 = local_950.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.data._M_elems + 5;
          *(uint (*) [2])puVar3 = local_9b8;
          *(uint (*) [2])(puVar3 + 2) = auStack_9b0;
          puVar3 = local_950.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.data._M_elems + 9;
          *(uint (*) [2])puVar3 = auStack_9a8;
          *(ulong *)(puVar3 + 2) = CONCAT44(local_99c,uStack_9a0);
          puVar3 = local_950.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.data._M_elems + 0xc;
          *(ulong *)puVar3 = CONCAT44(uStack_998,local_99c);
          *(undefined8 *)(puVar3 + 2) = auStack_994._0_8_;
          local_950.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.exp = local_a8c;
          local_950.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.neg = (bool)bVar24;
          local_950.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.fpclass = fVar28;
          local_950.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.prec_elem = local_a90;
          lp = local_a30;
          lVar29 = local_9d0;
        }
      }
      else {
        puVar3 = local_950.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.data._M_elems + 0xc;
        *(ulong *)puVar3 = CONCAT44(local_a28.data._M_elems[0xd],local_a28.data._M_elems[0xc]);
        *(ulong *)(puVar3 + 2) =
             CONCAT35(local_a28.data._M_elems[0xf]._1_3_,local_a28.data._M_elems._56_5_);
        puVar3 = local_950.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.data._M_elems + 8;
        *(ulong *)puVar3 = CONCAT44(local_a28.data._M_elems[9],local_a28.data._M_elems[8]);
        *(ulong *)(puVar3 + 2) = CONCAT44(local_a28.data._M_elems[0xb],local_a28.data._M_elems[10]);
        puVar3 = local_950.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.data._M_elems + 4;
        *(ulong *)puVar3 = CONCAT44(local_a28.data._M_elems[5],local_a28.data._M_elems[4]);
        *(ulong *)(puVar3 + 2) = CONCAT44(local_a28.data._M_elems[7],local_a28.data._M_elems[6]);
        *(ulong *)local_950.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.data._M_elems =
             CONCAT44(local_a28.data._M_elems[1],local_a28.data._M_elems[0]);
        *(ulong *)(local_950.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.data._M_elems + 2) =
             CONCAT44(local_a28.data._M_elems[3],local_a28.data._M_elems[2]);
        local_950.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.exp = local_a28.exp;
        local_950.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.neg = local_a28.neg;
        local_950.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.fpclass = local_a28.fpclass;
        local_950.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.prec_elem = local_a28.prec_elem;
        lp = local_a30;
        lVar29 = local_9d0;
      }
      pcVar22 = &(lp->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).object.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar27].m_backend;
      pcVar25 = &local_8b0.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar27].m_backend;
      local_a88.fpclass = cpp_dec_float_finite;
      local_a88.prec_elem = 0x10;
      local_a88.data._M_elems[0] = 0;
      local_a88.data._M_elems[1] = 0;
      local_a88.data._M_elems[2] = 0;
      local_a88.data._M_elems[3] = 0;
      local_a88.data._M_elems[4] = 0;
      local_a88.data._M_elems[5] = 0;
      local_a88.data._M_elems[6] = 0;
      local_a88.data._M_elems[7] = 0;
      local_a88.data._M_elems[8] = 0;
      local_a88.data._M_elems[9] = 0;
      local_a88.data._M_elems[10] = 0;
      local_a88.data._M_elems[0xb] = 0;
      local_a88.data._M_elems[0xc] = 0;
      local_a88.data._M_elems[0xd] = 0;
      local_a88.data._M_elems._56_5_ = 0;
      local_a88.data._M_elems[0xf]._1_3_ = 0;
      local_a88.exp = 0;
      local_a88.neg = false;
      pcVar23 = pcVar22;
      if ((&local_a88 != pcVar25) && (pcVar23 = pcVar25, &local_a88 != pcVar22)) {
        uVar10 = *(undefined8 *)(((cpp_dec_float<100U,_int,_void> *)&pcVar22->data)->data)._M_elems;
        uVar11 = *(undefined8 *)
                  ((((cpp_dec_float<100U,_int,_void> *)&pcVar22->data)->data)._M_elems + 2);
        uVar12 = *(undefined8 *)
                  ((((cpp_dec_float<100U,_int,_void> *)&pcVar22->data)->data)._M_elems + 4);
        uVar13 = *(undefined8 *)
                  ((((cpp_dec_float<100U,_int,_void> *)&pcVar22->data)->data)._M_elems + 6);
        uVar14 = *(undefined8 *)
                  ((((cpp_dec_float<100U,_int,_void> *)&pcVar22->data)->data)._M_elems + 8);
        uVar15 = *(undefined8 *)
                  ((((cpp_dec_float<100U,_int,_void> *)&pcVar22->data)->data)._M_elems + 10);
        uVar16 = *(undefined8 *)
                  ((((cpp_dec_float<100U,_int,_void> *)&pcVar22->data)->data)._M_elems + 0xc);
        uVar17 = *(undefined8 *)
                  ((((cpp_dec_float<100U,_int,_void> *)&pcVar22->data)->data)._M_elems + 0xe);
        local_a88.data._M_elems[0xc] = (uint)uVar16;
        local_a88.data._M_elems[0xd] = (uint)((ulong)uVar16 >> 0x20);
        local_a88.data._M_elems._56_5_ = SUB85(uVar17,0);
        local_a88.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar17 >> 0x28);
        local_a88.data._M_elems[8] = (uint)uVar14;
        local_a88.data._M_elems[9] = (uint)((ulong)uVar14 >> 0x20);
        local_a88.data._M_elems[10] = (uint)uVar15;
        local_a88.data._M_elems[0xb] = (uint)((ulong)uVar15 >> 0x20);
        local_a88.data._M_elems[4] = (uint)uVar12;
        local_a88.data._M_elems[5] = (uint)((ulong)uVar12 >> 0x20);
        local_a88.data._M_elems[6] = (uint)uVar13;
        local_a88.data._M_elems[7] = (uint)((ulong)uVar13 >> 0x20);
        local_a88.data._M_elems[0] = (uint)uVar10;
        local_a88.data._M_elems[1] = (uint)((ulong)uVar10 >> 0x20);
        local_a88.data._M_elems[2] = (uint)uVar11;
        local_a88.data._M_elems[3] = (uint)((ulong)uVar11 >> 0x20);
        local_a88.exp = pcVar22->exp;
        local_a88.neg = pcVar22->neg;
        local_a88.fpclass = pcVar22->fpclass;
        local_a88.prec_elem = pcVar22->prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                (&local_a88,pcVar23);
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                (&local_718,&local_a88);
      pcVar22 = &(lp->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).object.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar27].m_backend;
      pcVar25 = &local_8c8.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar27].m_backend;
      local_a88.fpclass = cpp_dec_float_finite;
      local_a88.prec_elem = 0x10;
      local_a88.data._M_elems[0] = 0;
      local_a88.data._M_elems[1] = 0;
      local_a88.data._M_elems[2] = 0;
      local_a88.data._M_elems[3] = 0;
      local_a88.data._M_elems[4] = 0;
      local_a88.data._M_elems[5] = 0;
      local_a88.data._M_elems[6] = 0;
      local_a88.data._M_elems[7] = 0;
      local_a88.data._M_elems[8] = 0;
      local_a88.data._M_elems[9] = 0;
      local_a88.data._M_elems[10] = 0;
      local_a88.data._M_elems[0xb] = 0;
      local_a88.data._M_elems[0xc] = 0;
      local_a88.data._M_elems[0xd] = 0;
      local_a88.data._M_elems._56_5_ = 0;
      local_a88.data._M_elems[0xf]._1_3_ = 0;
      local_a88.exp = 0;
      local_a88.neg = false;
      pcVar23 = pcVar22;
      if ((&local_a88 != pcVar25) && (pcVar23 = pcVar25, &local_a88 != pcVar22)) {
        uVar10 = *(undefined8 *)(((cpp_dec_float<100U,_int,_void> *)&pcVar22->data)->data)._M_elems;
        uVar11 = *(undefined8 *)
                  ((((cpp_dec_float<100U,_int,_void> *)&pcVar22->data)->data)._M_elems + 2);
        uVar12 = *(undefined8 *)
                  ((((cpp_dec_float<100U,_int,_void> *)&pcVar22->data)->data)._M_elems + 4);
        uVar13 = *(undefined8 *)
                  ((((cpp_dec_float<100U,_int,_void> *)&pcVar22->data)->data)._M_elems + 6);
        uVar14 = *(undefined8 *)
                  ((((cpp_dec_float<100U,_int,_void> *)&pcVar22->data)->data)._M_elems + 8);
        uVar15 = *(undefined8 *)
                  ((((cpp_dec_float<100U,_int,_void> *)&pcVar22->data)->data)._M_elems + 10);
        uVar16 = *(undefined8 *)
                  ((((cpp_dec_float<100U,_int,_void> *)&pcVar22->data)->data)._M_elems + 0xc);
        uVar17 = *(undefined8 *)
                  ((((cpp_dec_float<100U,_int,_void> *)&pcVar22->data)->data)._M_elems + 0xe);
        local_a88.data._M_elems[0xc] = (uint)uVar16;
        local_a88.data._M_elems[0xd] = (uint)((ulong)uVar16 >> 0x20);
        local_a88.data._M_elems._56_5_ = SUB85(uVar17,0);
        local_a88.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar17 >> 0x28);
        local_a88.data._M_elems[8] = (uint)uVar14;
        local_a88.data._M_elems[9] = (uint)((ulong)uVar14 >> 0x20);
        local_a88.data._M_elems[10] = (uint)uVar15;
        local_a88.data._M_elems[0xb] = (uint)((ulong)uVar15 >> 0x20);
        local_a88.data._M_elems[4] = (uint)uVar12;
        local_a88.data._M_elems[5] = (uint)((ulong)uVar12 >> 0x20);
        local_a88.data._M_elems[6] = (uint)uVar13;
        local_a88.data._M_elems[7] = (uint)((ulong)uVar13 >> 0x20);
        local_a88.data._M_elems[0] = (uint)uVar10;
        local_a88.data._M_elems[1] = (uint)((ulong)uVar10 >> 0x20);
        local_a88.data._M_elems[2] = (uint)uVar11;
        local_a88.data._M_elems[3] = (uint)((ulong)uVar11 >> 0x20);
        local_a88.exp = pcVar22->exp;
        local_a88.neg = pcVar22->neg;
        local_a88.fpclass = pcVar22->fpclass;
        local_a88.prec_elem = pcVar22->prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                (&local_a88,pcVar23);
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                (&local_768,&local_a88);
      pcVar22 = &(lp->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).object.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar27].m_backend;
      pcVar25 = &local_950.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar27].m_backend;
      local_a88.fpclass = cpp_dec_float_finite;
      local_a88.prec_elem = 0x10;
      local_a88.data._M_elems[0] = 0;
      local_a88.data._M_elems[1] = 0;
      local_a88.data._M_elems[2] = 0;
      local_a88.data._M_elems[3] = 0;
      local_a88.data._M_elems[4] = 0;
      local_a88.data._M_elems[5] = 0;
      local_a88.data._M_elems[6] = 0;
      local_a88.data._M_elems[7] = 0;
      local_a88.data._M_elems[8] = 0;
      local_a88.data._M_elems[9] = 0;
      local_a88.data._M_elems[10] = 0;
      local_a88.data._M_elems[0xb] = 0;
      local_a88.data._M_elems[0xc] = 0;
      local_a88.data._M_elems[0xd] = 0;
      local_a88.data._M_elems._56_5_ = 0;
      local_a88.data._M_elems[0xf]._1_3_ = 0;
      local_a88.exp = 0;
      local_a88.neg = false;
      pcVar23 = pcVar22;
      if ((&local_a88 != pcVar25) && (pcVar23 = pcVar25, &local_a88 != pcVar22)) {
        uVar10 = *(undefined8 *)(((cpp_dec_float<100U,_int,_void> *)&pcVar22->data)->data)._M_elems;
        uVar11 = *(undefined8 *)
                  ((((cpp_dec_float<100U,_int,_void> *)&pcVar22->data)->data)._M_elems + 2);
        uVar12 = *(undefined8 *)
                  ((((cpp_dec_float<100U,_int,_void> *)&pcVar22->data)->data)._M_elems + 4);
        uVar13 = *(undefined8 *)
                  ((((cpp_dec_float<100U,_int,_void> *)&pcVar22->data)->data)._M_elems + 6);
        uVar14 = *(undefined8 *)
                  ((((cpp_dec_float<100U,_int,_void> *)&pcVar22->data)->data)._M_elems + 8);
        uVar15 = *(undefined8 *)
                  ((((cpp_dec_float<100U,_int,_void> *)&pcVar22->data)->data)._M_elems + 10);
        uVar16 = *(undefined8 *)
                  ((((cpp_dec_float<100U,_int,_void> *)&pcVar22->data)->data)._M_elems + 0xc);
        uVar17 = *(undefined8 *)
                  ((((cpp_dec_float<100U,_int,_void> *)&pcVar22->data)->data)._M_elems + 0xe);
        local_a88.data._M_elems[0xc] = (uint)uVar16;
        local_a88.data._M_elems[0xd] = (uint)((ulong)uVar16 >> 0x20);
        local_a88.data._M_elems._56_5_ = SUB85(uVar17,0);
        local_a88.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar17 >> 0x28);
        local_a88.data._M_elems[8] = (uint)uVar14;
        local_a88.data._M_elems[9] = (uint)((ulong)uVar14 >> 0x20);
        local_a88.data._M_elems[10] = (uint)uVar15;
        local_a88.data._M_elems[0xb] = (uint)((ulong)uVar15 >> 0x20);
        local_a88.data._M_elems[4] = (uint)uVar12;
        local_a88.data._M_elems[5] = (uint)((ulong)uVar12 >> 0x20);
        local_a88.data._M_elems[6] = (uint)uVar13;
        local_a88.data._M_elems[7] = (uint)((ulong)uVar13 >> 0x20);
        local_a88.data._M_elems[0] = (uint)uVar10;
        local_a88.data._M_elems[1] = (uint)((ulong)uVar10 >> 0x20);
        local_a88.data._M_elems[2] = (uint)uVar11;
        local_a88.data._M_elems[3] = (uint)((ulong)uVar11 >> 0x20);
        local_a88.exp = pcVar22->exp;
        local_a88.neg = pcVar22->neg;
        local_a88.fpclass = pcVar22->fpclass;
        local_a88.prec_elem = pcVar22->prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                (&local_a88,pcVar23);
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                (&local_7b8,&local_a88);
      lVar27 = local_920;
    } while (1 < lVar29);
  }
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::vector(&local_7d0,&local_8b0);
  bVar19 = checkSolution(this,lp,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)&local_7d0);
  if (local_7d0.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_7d0.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_7d0.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_7d0.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (((bVar19) && (local_718.fpclass != cpp_dec_float_NaN)) &&
     ((this->m_cutoffbound).m_backend.fpclass != cpp_dec_float_NaN)) {
    iVar21 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                       (&local_718,&(this->m_cutoffbound).m_backend);
    if (0 < iVar21) {
      *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 0xc) =
           local_718.data._M_elems._48_8_;
      *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 0xe) =
           local_718.data._M_elems._56_8_;
      *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 8) =
           local_718.data._M_elems._32_8_;
      *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 10) =
           local_718.data._M_elems._40_8_;
      *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 4) =
           local_718.data._M_elems._16_8_;
      *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 6) =
           local_718.data._M_elems._24_8_;
      *(undefined8 *)(this->m_cutoffbound).m_backend.data._M_elems = local_718.data._M_elems._0_8_;
      *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 2) =
           local_718.data._M_elems._8_8_;
      (this->m_cutoffbound).m_backend.exp = local_718.exp;
      (this->m_cutoffbound).m_backend.neg = local_718.neg;
      (this->m_cutoffbound).m_backend.fpclass = local_718.fpclass;
      (this->m_cutoffbound).m_backend.prec_elem = local_718.prec_elem;
    }
  }
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::vector(&local_7e8,&local_8c8);
  bVar19 = checkSolution(this,lp,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)&local_7e8);
  if (local_7e8.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_7e8.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_7e8.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_7e8.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (((bVar19) && (local_768.fpclass != cpp_dec_float_NaN)) &&
     ((this->m_cutoffbound).m_backend.fpclass != cpp_dec_float_NaN)) {
    iVar21 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                       (&local_768,&(this->m_cutoffbound).m_backend);
    if (0 < iVar21) {
      *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 0xc) =
           local_768.data._M_elems._48_8_;
      *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 0xe) =
           local_768.data._M_elems._56_8_;
      *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 8) =
           local_768.data._M_elems._32_8_;
      *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 10) =
           local_768.data._M_elems._40_8_;
      *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 4) =
           local_768.data._M_elems._16_8_;
      *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 6) =
           local_768.data._M_elems._24_8_;
      *(undefined8 *)(this->m_cutoffbound).m_backend.data._M_elems = local_768.data._M_elems._0_8_;
      *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 2) =
           local_768.data._M_elems._8_8_;
      (this->m_cutoffbound).m_backend.exp = local_768.exp;
      (this->m_cutoffbound).m_backend.neg = local_768.neg;
      (this->m_cutoffbound).m_backend.fpclass = local_768.fpclass;
      (this->m_cutoffbound).m_backend.prec_elem = local_768.prec_elem;
    }
  }
  if (bVar18) {
    std::
    vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ::vector(&local_800,&local_840);
    bVar18 = checkSolution(this,lp,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)&local_800);
    if (local_800.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_800.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_800.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_800.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    bVar18 = false;
  }
  if (((bVar18 != false) && (local_6c8.fpclass != cpp_dec_float_NaN)) &&
     ((this->m_cutoffbound).m_backend.fpclass != cpp_dec_float_NaN)) {
    iVar21 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                       (&local_6c8,&(this->m_cutoffbound).m_backend);
    if (0 < iVar21) {
      *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 0xc) =
           local_6c8.data._M_elems._48_8_;
      *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 0xe) =
           local_6c8.data._M_elems._56_8_;
      *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 8) =
           local_6c8.data._M_elems._32_8_;
      *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 10) =
           local_6c8.data._M_elems._40_8_;
      *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 4) =
           local_6c8.data._M_elems._16_8_;
      *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 6) =
           local_6c8.data._M_elems._24_8_;
      *(undefined8 *)(this->m_cutoffbound).m_backend.data._M_elems = local_6c8.data._M_elems._0_8_;
      *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 2) =
           local_6c8.data._M_elems._8_8_;
      (this->m_cutoffbound).m_backend.exp = local_6c8.exp;
      (this->m_cutoffbound).m_backend.neg = local_6c8.neg;
      (this->m_cutoffbound).m_backend.fpclass = local_6c8.fpclass;
      (this->m_cutoffbound).m_backend.prec_elem = local_6c8.prec_elem;
    }
  }
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::vector(&local_818,&local_950);
  bVar18 = checkSolution(this,lp,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)&local_818);
  if (local_818.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_818.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_818.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_818.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (((bVar18) && (local_7b8.fpclass != cpp_dec_float_NaN)) &&
     ((this->m_cutoffbound).m_backend.fpclass != cpp_dec_float_NaN)) {
    iVar21 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                       (&local_7b8,&(this->m_cutoffbound).m_backend);
    if (0 < iVar21) {
      *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 0xc) =
           local_7b8.data._M_elems._48_8_;
      *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 0xe) =
           local_7b8.data._M_elems._56_8_;
      *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 8) =
           local_7b8.data._M_elems._32_8_;
      *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 10) =
           local_7b8.data._M_elems._40_8_;
      *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 4) =
           local_7b8.data._M_elems._16_8_;
      *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 6) =
           local_7b8.data._M_elems._24_8_;
      *(undefined8 *)(this->m_cutoffbound).m_backend.data._M_elems = local_7b8.data._M_elems._0_8_;
      *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 2) =
           local_7b8.data._M_elems._8_8_;
      (this->m_cutoffbound).m_backend.exp = local_7b8.exp;
      (this->m_cutoffbound).m_backend.neg = local_7b8.neg;
      (this->m_cutoffbound).m_backend.fpclass = local_7b8.fpclass;
      (this->m_cutoffbound).m_backend.prec_elem = local_7b8.prec_elem;
    }
  }
  if (local_980.val.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_980.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_980.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_980.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_968.val.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_968.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_968.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_968.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_950.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_950.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_950.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_950.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_8c8.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_8c8.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_8c8.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_8c8.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_8b0.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_8b0.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_8b0.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_8b0.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_840.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_840.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_840.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_840.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SPxMainSM<R>::trivialHeuristic(SPxLPBase<R>& lp)
{
   VectorBase<R>         zerosol(lp.nCols());  // the zero solution VectorBase<R>
   VectorBase<R>         lowersol(lp.nCols()); // the lower bound solution VectorBase<R>
   VectorBase<R>         uppersol(lp.nCols()); // the upper bound solution VectorBase<R>
   VectorBase<R>         locksol(lp.nCols());  // the locks solution VectorBase<R>

   VectorBase<R>         upLocks(lp.nCols());
   VectorBase<R>         downLocks(lp.nCols());

   R            zeroObj = this->m_objoffset;
   R            lowerObj = this->m_objoffset;
   R            upperObj = this->m_objoffset;
   R            lockObj = this->m_objoffset;

   bool            zerovalid = true;

   R largeValue = R(infinity);

   if(LT(R(1.0 / feastol()), R(infinity), this->tolerances()->epsilon()))
      largeValue = 1.0 / feastol();



   for(int j = lp.nCols() - 1; j >= 0; --j)
   {
      upLocks[j] = 0;
      downLocks[j] = 0;

      // computing the locks on the variables
      const SVectorBase<R>& col = lp.colVector(j);

      for(int k = 0; k < col.size(); ++k)
      {
         R aij = col.value(k);

         SOPLEX_ASSERT_WARN("WMAISM45", isNotZero(aij, R(1.0 / R(infinity))));

         if(GT(lp.lhs(col.index(k)), R(-infinity), this->tolerances()->epsilon())
               && LT(lp.rhs(col.index(k)), R(infinity), this->tolerances()->epsilon()))
         {
            upLocks[j]++;
            downLocks[j]++;
         }
         else if(GT(lp.lhs(col.index(k)), R(-infinity), this->tolerances()->epsilon()))
         {
            if(aij > 0)
               downLocks[j]++;
            else if(aij < 0)
               upLocks[j]++;
         }
         else if(LT(lp.rhs(col.index(k)), R(infinity), this->tolerances()->epsilon()))
         {
            if(aij > 0)
               upLocks[j]++;
            else if(aij < 0)
               downLocks[j]++;
         }
      }

      R lower = lp.lower(j);
      R upper = lp.upper(j);

      if(LE(lower, R(-infinity), this->tolerances()->epsilon()))
         lower = SOPLEX_MIN(-largeValue, upper);

      if(GE(upper, R(infinity), this->tolerances()->epsilon()))
         upper = SOPLEX_MAX(lp.lower(j), largeValue);

      if(zerovalid)
      {
         if(LE(lower, R(0.0), feastol()) && GE(upper, R(0.0), feastol()))
            zerosol[j] = 0.0;
         else
            zerovalid = false;
      }

      lowersol[j] = lower;
      uppersol[j] = upper;

      if(downLocks[j] > upLocks[j])
         locksol[j] = upper;
      else if(downLocks[j] < upLocks[j])
         locksol[j] = lower;
      else
         locksol[j] = (lower + upper) / 2.0;

      lowerObj += lp.maxObj(j) * lowersol[j];
      upperObj += lp.maxObj(j) * uppersol[j];
      lockObj += lp.maxObj(j) * locksol[j];
   }

   // trying the lower bound solution
   if(checkSolution(lp, lowersol))
   {
      if(lowerObj > m_cutoffbound)
         m_cutoffbound = lowerObj;
   }

   // trying the upper bound solution
   if(checkSolution(lp, uppersol))
   {
      if(upperObj > m_cutoffbound)
         m_cutoffbound = upperObj;
   }

   // trying the zero solution
   if(zerovalid && checkSolution(lp, zerosol))
   {
      if(zeroObj > m_cutoffbound)
         m_cutoffbound = zeroObj;
   }

   // trying the lock solution
   if(checkSolution(lp, locksol))
   {
      if(lockObj > m_cutoffbound)
         m_cutoffbound = lockObj;
   }
}